

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O1

void __thiscall
InfoRecordDouble::InfoRecordDouble
          (InfoRecordDouble *this,string *Xname,string *Xdescription,bool Xadvanced,
          double *Xvalue_pointer,double Xdefault_value)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  pcVar1 = (Xname->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + Xname->_M_string_length);
  pcVar1 = (Xdescription->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + Xdescription->_M_string_length);
  InfoRecord::InfoRecord(&this->super_InfoRecord,kDouble,&local_50,&local_70,Xadvanced);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_InfoRecord)._vptr_InfoRecord = (_func_int **)&PTR__InfoRecord_00448cc8;
  this->value = Xvalue_pointer;
  this->default_value = Xdefault_value;
  *Xvalue_pointer = Xdefault_value;
  return;
}

Assistant:

InfoRecordDouble(std::string Xname, std::string Xdescription, bool Xadvanced,
                   double* Xvalue_pointer, double Xdefault_value)
      : InfoRecord(HighsInfoType::kDouble, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    default_value = Xdefault_value;
    *value = default_value;
  }